

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

void helper_fsincos_x86_64(CPUX86State *env)

{
  float_status *status;
  byte *pbVar1;
  double dVar2;
  uint uVar3;
  double a;
  floatx80 fVar4;
  
  status = &env->fp_status;
  fVar4._8_4_ = *(undefined4 *)((long)env->fpregs + (ulong)env->fpstt * 0x10 + 8);
  fVar4.low = env->fpregs[env->fpstt].d.low;
  fVar4._12_4_ = 0;
  dVar2 = (double)floatx80_to_float64_x86_64(fVar4,status);
  if (ABS(dVar2) <= 9.223372036854776e+18) {
    uVar3 = env->fpstt;
    a = sin(dVar2);
    fVar4 = float64_to_floatx80_x86_64((float64)a,status);
    env->fpregs[uVar3].d.low = fVar4.low;
    *(uint16_t *)((long)env->fpregs + (ulong)uVar3 * 0x10 + 8) = fVar4.high;
    uVar3 = env->fpstt - 1 & 7;
    env->fpstt = uVar3;
    env->fptags[uVar3] = '\0';
    dVar2 = cos(dVar2);
    fVar4 = float64_to_floatx80_x86_64((float64)dVar2,status);
    *(uint64_t *)((long)env->fpregs + (ulong)(uVar3 << 4)) = fVar4.low;
    *(uint16_t *)((long)env->fpregs + (ulong)(uVar3 << 4) + 8) = fVar4.high;
    pbVar1 = (byte *)((long)&env->fpus + 1);
    *pbVar1 = *pbVar1 & 0xfb;
  }
  else {
    pbVar1 = (byte *)((long)&env->fpus + 1);
    *pbVar1 = *pbVar1 | 4;
  }
  return;
}

Assistant:

void helper_fsincos(CPUX86State *env)
{
    double fptemp = floatx80_to_double(env, ST0);

    if ((fptemp > MAXTAN) || (fptemp < -MAXTAN)) {
        env->fpus |= 0x400;
    } else {
        ST0 = double_to_floatx80(env, sin(fptemp));
        fpush(env);
        ST0 = double_to_floatx80(env, cos(fptemp));
        env->fpus &= ~0x400;  /* C2 <-- 0 */
        /* the above code is for |arg| < 2**63 only */
    }
}